

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

bool ImGui::FocusableItemRegister(ImGuiWindow *window,ImGuiID id,bool tab_stop)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  bool bVar3;
  int iVar4;
  
  pIVar2 = GImGui;
  uVar1 = (window->DC).ItemFlags;
  window->FocusIdxAllCounter = window->FocusIdxAllCounter + 1;
  if ((uVar1 & 1) != 0) {
    window->FocusIdxTabCounter = window->FocusIdxTabCounter + 1;
  }
  if ((((tab_stop) && (pIVar2->ActiveId == id)) && (window->FocusIdxAllRequestNext == 0x7fffffff))
     && ((window->FocusIdxTabRequestNext == 0x7fffffff && ((pIVar2->IO).KeyCtrl == false)))) {
    bVar3 = IsKeyPressedMap(0,true);
    if (bVar3) {
      iVar4 = 1;
      if ((pIVar2->IO).KeyShift != false) {
        iVar4 = -(uVar1 & 1);
      }
      window->FocusIdxTabRequestNext = iVar4 + window->FocusIdxTabCounter;
    }
  }
  bVar3 = true;
  if ((window->FocusIdxAllCounter != window->FocusIdxAllRequestCurrent) &&
     (((uVar1 & 1) == 0 || (window->FocusIdxTabCounter != window->FocusIdxTabRequestCurrent)))) {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ImGui::FocusableItemRegister(ImGuiWindow* window, ImGuiID id, bool tab_stop)
{
    ImGuiContext& g = *GImGui;

    const bool allow_keyboard_focus = (window->DC.ItemFlags & ImGuiItemFlags_AllowKeyboardFocus) != 0;
    window->FocusIdxAllCounter++;
    if (allow_keyboard_focus)
        window->FocusIdxTabCounter++;

    // Process keyboard input at this point: TAB/Shift-TAB to tab out of the currently focused item.
    // Note that we can always TAB out of a widget that doesn't allow tabbing in.
    if (tab_stop && (g.ActiveId == id) && window->FocusIdxAllRequestNext == INT_MAX && window->FocusIdxTabRequestNext == INT_MAX && !g.IO.KeyCtrl && IsKeyPressedMap(ImGuiKey_Tab))
        window->FocusIdxTabRequestNext = window->FocusIdxTabCounter + (g.IO.KeyShift ? (allow_keyboard_focus ? -1 : 0) : +1); // Modulo on index will be applied at the end of frame once we've got the total counter of items.

    if (window->FocusIdxAllCounter == window->FocusIdxAllRequestCurrent)
        return true;

    if (allow_keyboard_focus)
        if (window->FocusIdxTabCounter == window->FocusIdxTabRequestCurrent)
            return true;

    return false;
}